

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

uint32_t __thiscall xatlas::internal::AABB::maxDimension(AABB *this)

{
  Vector3 VVar1;
  
  VVar1 = operator-(&this->max,&this->min);
  if (VVar1.y <= VVar1.x) {
    if (VVar1.z <= VVar1.x) {
      return 0;
    }
  }
  else if (VVar1.z <= VVar1.y) {
    return 1;
  }
  return 2;
}

Assistant:

uint32_t maxDimension() const
	{
		const Vector3 extent = max - min;
		uint32_t result = 0;
		if (extent.y > extent.x) {
			result = 1;
			if (extent.z > extent.y)
				result = 2;
		}
		else if(extent.z > extent.x)
			result = 2;
		return result;
	}